

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::processPath
               (XMLCh *pathStr,XMLSize_t pathStrLen,bool isSchemePresent,bool bAllowSpaces)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  XMLCh XVar5;
  bool bVar6;
  
  if (pathStrLen != 0) {
    bVar6 = true;
    if (isSchemePresent) {
      bVar6 = *pathStr == L'/';
    }
    XVar5 = L'\0';
    for (uVar3 = 0; uVar4 = pathStrLen, pathStrLen != uVar3; uVar3 = uVar3 + 1) {
      XVar5 = pathStr[uVar3];
      if (XVar5 == L' ') {
        if (!bAllowSpaces) {
          return false;
        }
      }
      else {
        if (XVar5 == L'%') {
          if (pathStrLen <= uVar3 + 2) {
            return false;
          }
          bVar1 = XMLString::isHex(pathStr[uVar3 + 1]);
          if (!bVar1) {
            return false;
          }
          bVar1 = XMLString::isHex(pathStr[uVar3 + 2]);
        }
        else {
          uVar4 = uVar3;
          if ((XVar5 == L'#') || (XVar5 == L'?')) break;
          bVar1 = isUnreservedCharacter(XVar5);
          if (bVar1) goto LAB_0026b4ed;
          if (bVar6) {
            bVar1 = isPathCharacter(XVar5);
          }
          else {
            bVar1 = isReservedCharacter(XVar5);
          }
        }
        if (bVar1 == false) {
          return false;
        }
      }
LAB_0026b4ed:
    }
    if ((XVar5 == L'?') || (XVar5 == L'#')) {
      bVar6 = XVar5 == L'?';
LAB_0026b526:
      uVar3 = uVar4 + 3;
      do {
        uVar4 = uVar3 - 2;
        bVar1 = pathStrLen <= uVar4;
        if (bVar1) {
          return bVar1;
        }
        XVar5 = pathStr[uVar3 - 2];
        if (XVar5 == L' ') {
          if (!bAllowSpaces) {
            return bVar1;
          }
        }
        else {
          if (XVar5 == L'%') {
            if (pathStrLen <= uVar3) {
              return bVar1;
            }
            bVar2 = XMLString::isHex(pathStr[uVar3 - 1]);
            if (!bVar2) {
              return bVar1;
            }
            bVar2 = XMLString::isHex(pathStr[uVar3]);
          }
          else {
            if ((XVar5 == L'#') && (bVar6)) goto LAB_0026b58d;
            bVar2 = isReservedOrUnreservedCharacter(XVar5);
          }
          if (bVar2 == false) {
            return bVar1;
          }
        }
        uVar3 = uVar3 + 1;
      } while( true );
    }
  }
  return true;
LAB_0026b58d:
  bVar6 = false;
  goto LAB_0026b526;
}

Assistant:

bool XMLUri::processPath(const XMLCh* const pathStr,
                         const XMLSize_t pathStrLen,
                         const bool isSchemePresent,
                         const bool bAllowSpaces/*=false*/)
{
    if (pathStrLen != 0)
    {
        XMLSize_t index = 0;
        XMLCh testChar = chNull;
        bool isOpaque = (!isSchemePresent || *pathStr == chForwardSlash);

        // path - everything up to query string or fragment
        //
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        while (index < pathStrLen)
        {
            testChar = pathStr[index];
            if (testChar == chQuestion || testChar == chPound)
                break;

            if (testChar == chPercent)
            {
                if (index+2 >= pathStrLen ||
                    !XMLString::isHex(pathStr[index+1]) ||
                    !XMLString::isHex(pathStr[index+2]))
                        return false;
            }
            else if (testChar==chSpace)
            {
                if(!bAllowSpaces)
                    return false;
            }
            else if (!isUnreservedCharacter(testChar) &&
                     ((isOpaque && !isPathCharacter(testChar)) ||
                      (!isOpaque && !isReservedCharacter(testChar))))
            {
                return false;
            }

            index++;
        }

        // query - starts with ? and up to fragment or end
        // fragment - starts with #
        bool isQuery = (testChar == chQuestion);
        if (isQuery || testChar == chPound)
        {
            index++;
            while (index < pathStrLen)
            {
                testChar = pathStr[index];
                if (testChar == chPound && isQuery) {
                    isQuery = false;
                    index++;
                    continue;
                }

                if (testChar == chPercent)
                {
                    if (index+2 >= pathStrLen ||
                        !XMLString::isHex(pathStr[index+1]) ||
                        !XMLString::isHex(pathStr[index+2]))
                        return false;
                }
                else if (testChar==chSpace)
                {
                    if(!bAllowSpaces)
                        return false;
                }
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    return false;
                }
                index++;
            }
        }
    } //if (pathStrLen...)

    return true;
}